

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::SeriesMatcher::match
          (SeriesMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  int32_t start;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ParsedNumber backup;
  byte local_132;
  byte local_131;
  ParsedNumber local_110;
  
  ParsedNumber::ParsedNumber(&local_110,result);
  start = StringSegment::getOffset(segment);
  iVar4 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[7])
                    (this);
  local_132 = 1;
  puVar9 = (undefined8 *)CONCAT44(extraout_var,iVar4);
  do {
    puVar8 = puVar9;
    iVar4 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[8])
                      (this);
    if ((undefined8 *)CONCAT44(extraout_var_00,iVar4) <= puVar8) break;
    plVar1 = (long *)*puVar8;
    iVar5 = StringSegment::getOffset(segment);
    iVar6 = StringSegment::length(segment);
    if (iVar6 == 0) {
      local_132 = 1;
    }
    else {
      local_132 = (**(code **)(*plVar1 + 0x18))(plVar1,segment,result,status);
    }
    iVar6 = StringSegment::getOffset(segment);
    bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1);
    puVar9 = puVar8;
    if ((iVar6 != iVar5 & bVar3) == 0) {
      if (iVar6 == iVar5) {
        if (bVar3 == 0) {
          StringSegment::setOffset(segment,start);
          ParsedNumber::operator=(result,&local_110);
          bVar2 = false;
          local_131 = local_132;
        }
        else {
          bVar2 = true;
          puVar9 = puVar8 + 1;
        }
      }
      else {
        bVar2 = true;
        iVar7 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher
                  [8])(this);
        puVar9 = puVar8 + 1;
        if (puVar9 < (undefined8 *)CONCAT44(extraout_var_01,iVar7)) {
          iVar6 = StringSegment::getOffset(segment);
          iVar7 = result->charEnd;
          if (iVar5 < iVar7 && iVar6 != iVar7) {
            StringSegment::setOffset(segment,iVar7);
          }
        }
      }
    }
    else {
      bVar2 = true;
    }
  } while (bVar2);
  if (puVar8 < (undefined8 *)CONCAT44(extraout_var_00,iVar4)) {
    local_132 = local_131;
  }
  UnicodeString::~UnicodeString(&local_110.suffix);
  UnicodeString::~UnicodeString(&local_110.prefix);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_110.quantity);
  return (bool)(local_132 & 1);
}

Assistant:

bool SeriesMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    ParsedNumber backup(result);

    int32_t initialOffset = segment.getOffset();
    bool maybeMore = true;
    for (auto* it = begin(); it < end();) {
        const NumberParseMatcher* matcher = *it;
        int matcherOffset = segment.getOffset();
        if (segment.length() != 0) {
            maybeMore = matcher->match(segment, result, status);
        } else {
            // Nothing for this matcher to match; ask for more.
            maybeMore = true;
        }

        bool success = (segment.getOffset() != matcherOffset);
        bool isFlexible = matcher->isFlexible();
        if (success && isFlexible) {
            // Match succeeded, and this is a flexible matcher. Re-run it.
        } else if (success) {
            // Match succeeded, and this is NOT a flexible matcher. Proceed to the next matcher.
            it++;
            // Small hack: if there is another matcher coming, do not accept trailing weak chars.
            // Needed for proper handling of currency spacing.
            if (it < end() && segment.getOffset() != result.charEnd && result.charEnd > matcherOffset) {
                segment.setOffset(result.charEnd);
            }
        } else if (isFlexible) {
            // Match failed, and this is a flexible matcher. Try again with the next matcher.
            it++;
        } else {
            // Match failed, and this is NOT a flexible matcher. Exit.
            segment.setOffset(initialOffset);
            result = backup;
            return maybeMore;
        }
    }

    // All matchers in the series succeeded.
    return maybeMore;
}